

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

QByteArray * QTimeZonePrivate::aliasToIana(QByteArrayView alias)

{
  long lVar1;
  AliasData *pAVar2;
  AliasData *pAVar3;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  AliasData *data;
  QByteArrayView *in_stack_ffffffffffffff88;
  QByteArrayView *lhs;
  _func_bool_AliasData_QByteArrayView *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool bVar4;
  AliasData *in_stack_ffffffffffffffb8;
  QByteArrayView *__first;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = in_RDI;
  __first = in_RDI;
  std::begin<QtTimeZoneCldr::AliasData_const,154ul>
            ((AliasData (*) [154])QtTimeZoneCldr::aliasMappingTable);
  std::end<QtTimeZoneCldr::AliasData_const,154ul>
            ((AliasData (*) [154])QtTimeZoneCldr::aliasMappingTable);
  pAVar2 = std::
           lower_bound<QtTimeZoneCldr::AliasData_const*,QByteArrayView,bool(*)(QtTimeZoneCldr::AliasData,QByteArrayView)noexcept>
                     ((AliasData *)__first,in_stack_ffffffffffffffb8,
                      (QByteArrayView *)
                      CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8);
  pAVar3 = std::end<QtTimeZoneCldr::AliasData_const,154ul>
                     ((AliasData (*) [154])QtTimeZoneCldr::aliasMappingTable);
  bVar4 = false;
  if (pAVar2 != pAVar3) {
    QtTimeZoneCldr::AliasData::aliasId((AliasData *)lhs);
    bVar4 = ::operator==(lhs,in_stack_ffffffffffffff88);
  }
  if (bVar4 == false) {
    QByteArray::QByteArray((QByteArray *)0x73b046);
  }
  else {
    QtTimeZoneCldr::AliasData::ianaId((AliasData *)lhs);
    QByteArrayView::toByteArray(lhs);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QTimeZonePrivate::aliasToIana(QByteArrayView alias)
{
    const auto data = std::lower_bound(std::begin(aliasMappingTable), std::end(aliasMappingTable),
                                       alias, earlierAliasId);
    if (data != std::end(aliasMappingTable) && data->aliasId() == alias)
        return data->ianaId().toByteArray();
    // Note: empty return means not an alias, which is true of an ID that others
    // are aliases to, as the table omits self-alias entries. Let caller sort
    // that out, rather than allocating to return alias.toByteArray().
    return {};
}